

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  epoll_event dummy;
  
  lVar1 = *(long *)((long)loop->internal_fields + 0x1d8);
  if (lVar1 != 0) {
    lVar2 = 4;
    for (lVar3 = 0; lVar3 < *(int *)(lVar1 + 0x10); lVar3 = lVar3 + 1) {
      if (*(int *)(*(long *)(lVar1 + 8) + lVar2) == fd) {
        *(undefined4 *)(*(long *)(lVar1 + 8) + lVar2) = 0xffffffff;
      }
      lVar2 = lVar2 + 0xc;
    }
  }
  dummy.data.u64._4_4_ = 0;
  dummy._0_8_ = 0;
  epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)&dummy);
  return;
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  uv__loop_internal_fields_t* lfields;
  struct uv__invalidate* inv;
  struct epoll_event dummy;
  int i;

  lfields = uv__get_internal_fields(loop);
  inv = lfields->inv;

  /* Invalidate events with same file descriptor */
  if (inv != NULL)
    for (i = 0; i < inv->nfds; i++)
      if (inv->events[i].data.fd == fd)
        inv->events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * Perform EPOLL_CTL_DEL immediately instead of going through
   * io_uring's submit queue, otherwise the file descriptor may
   * be closed by the time the kernel starts the operation.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   *
   * Work around a bug in kernels 3.10 to 3.19 where passing a struct that
   * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
   */
  memset(&dummy, 0, sizeof(dummy));
  epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
}